

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

void init::SetLoggingOptions(ArgsManager *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string arg;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  Logger *pLVar4;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff28;
  char *pcVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffff38;
  undefined1 local_a0 [32];
  path local_80;
  path local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  paVar1 = &local_58._M_pathname.field_2;
  local_58._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"-debuglogfile","");
  bVar3 = ArgsManager::IsArgNegated(args,&local_58._M_pathname);
  pLVar4 = LogInstance();
  pLVar4->m_print_to_file = !bVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_pathname._M_dataplus._M_p,
                    local_58._M_pathname.field_2._M_allocated_capacity + 1);
  }
  local_a0._0_8_ = local_a0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"-debuglogfile","");
  pcVar5 = "debug.log";
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            ((path *)&stack0xffffffffffffff38,(char **)&stack0xffffffffffffff30,auto_format);
  arg._M_string_length = (size_type)pcVar5;
  arg._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff28;
  arg.field_2 = in_stack_ffffffffffffff38;
  ArgsManager::GetPathArg((path *)(local_a0 + 0x20),args,arg,(path *)local_a0);
  AbsPathForConfigVal((path *)&local_58,args,(path *)(local_a0 + 0x20),true);
  pLVar4 = LogInstance();
  if (&local_58 != &(pLVar4->m_file_path).super_path) {
    SetLoggingOptions();
  }
  std::filesystem::__cxx11::path::~path(&local_58);
  std::filesystem::__cxx11::path::~path((path *)(local_a0 + 0x20));
  std::filesystem::__cxx11::path::~path((path *)&stack0xffffffffffffff38);
  if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  local_58._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"-printtoconsole","");
  paVar2 = &local_80._M_pathname.field_2;
  local_80._M_pathname._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_a0 + 0x20),"-daemon","");
  bVar3 = ArgsManager::GetBoolArg(args,(string *)(local_a0 + 0x20),false);
  bVar3 = ArgsManager::GetBoolArg(args,&local_58._M_pathname,!bVar3);
  pLVar4 = LogInstance();
  pLVar4->m_print_to_console = bVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_pathname._M_dataplus._M_p != paVar2) {
    operator_delete(local_80._M_pathname._M_dataplus._M_p,
                    local_80._M_pathname.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_pathname._M_dataplus._M_p,
                    local_58._M_pathname.field_2._M_allocated_capacity + 1);
  }
  local_58._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"-logtimestamps","");
  bVar3 = ArgsManager::GetBoolArg(args,&local_58._M_pathname,true);
  pLVar4 = LogInstance();
  pLVar4->m_log_timestamps = bVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_pathname._M_dataplus._M_p,
                    local_58._M_pathname.field_2._M_allocated_capacity + 1);
  }
  local_58._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"-logtimemicros","");
  bVar3 = ArgsManager::GetBoolArg(args,&local_58._M_pathname,false);
  pLVar4 = LogInstance();
  pLVar4->m_log_time_micros = bVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_pathname._M_dataplus._M_p,
                    local_58._M_pathname.field_2._M_allocated_capacity + 1);
  }
  local_58._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"-logthreadnames","");
  bVar3 = ArgsManager::GetBoolArg(args,&local_58._M_pathname,false);
  pLVar4 = LogInstance();
  pLVar4->m_log_threadnames = bVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_pathname._M_dataplus._M_p,
                    local_58._M_pathname.field_2._M_allocated_capacity + 1);
  }
  local_58._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"-logsourcelocations","");
  bVar3 = ArgsManager::GetBoolArg(args,&local_58._M_pathname,false);
  pLVar4 = LogInstance();
  pLVar4->m_log_sourcelocations = bVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_pathname._M_dataplus._M_p,
                    local_58._M_pathname.field_2._M_allocated_capacity + 1);
  }
  local_58._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"-loglevelalways","");
  bVar3 = ArgsManager::GetBoolArg(args,&local_58._M_pathname,false);
  pLVar4 = LogInstance();
  pLVar4->m_always_print_category_level = bVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_pathname._M_dataplus._M_p,
                    local_58._M_pathname.field_2._M_allocated_capacity + 1);
  }
  local_58._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"-logips","");
  fLogIPs = ArgsManager::GetBoolArg(args,&local_58._M_pathname,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_pathname._M_dataplus._M_p,
                    local_58._M_pathname.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SetLoggingOptions(const ArgsManager& args)
{
    LogInstance().m_print_to_file = !args.IsArgNegated("-debuglogfile");
    LogInstance().m_file_path = AbsPathForConfigVal(args, args.GetPathArg("-debuglogfile", DEFAULT_DEBUGLOGFILE));
    LogInstance().m_print_to_console = args.GetBoolArg("-printtoconsole", !args.GetBoolArg("-daemon", false));
    LogInstance().m_log_timestamps = args.GetBoolArg("-logtimestamps", DEFAULT_LOGTIMESTAMPS);
    LogInstance().m_log_time_micros = args.GetBoolArg("-logtimemicros", DEFAULT_LOGTIMEMICROS);
    LogInstance().m_log_threadnames = args.GetBoolArg("-logthreadnames", DEFAULT_LOGTHREADNAMES);
    LogInstance().m_log_sourcelocations = args.GetBoolArg("-logsourcelocations", DEFAULT_LOGSOURCELOCATIONS);
    LogInstance().m_always_print_category_level = args.GetBoolArg("-loglevelalways", DEFAULT_LOGLEVELALWAYS);

    fLogIPs = args.GetBoolArg("-logips", DEFAULT_LOGIPS);
}